

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigsBoundsCase::checkGetConfigsBounds
          (GetConfigsBoundsCase *this,Random *rnd,int numConfigAll,int numConfigRequested)

{
  value_type pvVar1;
  EGLDisplay dpy;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  deUint32 dVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  reference ppvVar9;
  MessageBuilder *pMVar10;
  MessageBuilder local_828;
  MessageBuilder local_6a8;
  MessageBuilder local_528;
  MessageBuilder local_3a8;
  ulong local_228;
  size_t ndx_2;
  undefined1 local_218 [4];
  int numOverwritten;
  ulong local_98;
  size_t ndx_1;
  size_t ndx;
  reference pvStack_80;
  int numConfigReturned;
  EGLConfig *magicConfigs;
  undefined1 local_70 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> magicBuffer;
  allocator<void_*> local_41;
  undefined1 local_40 [8];
  vector<void_*,_std::allocator<void_*>_> buffer;
  TestLog *log;
  int numConfigRequested_local;
  int numConfigAll_local;
  Random *rnd_local;
  GetConfigsBoundsCase *this_local;
  
  buffer.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       &tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  std::allocator<void_*>::allocator(&local_41);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_40,(long)(numConfigAll + 10),&local_41
            );
  std::allocator<void_*>::~allocator(&local_41);
  sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)local_40);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&magicConfigs + 7));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
             (sVar7 & 0x1fffffffffffffff) * 2 + 1,
             (allocator<unsigned_int> *)((long)&magicConfigs + 7));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&magicConfigs + 7));
  pvStack_80 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,0);
  for (ndx_1 = 0; sVar4 = ndx_1,
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70),
      sVar4 < sVar7; ndx_1 = ndx_1 + 1) {
    dVar5 = de::Random::getUint32(rnd);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,ndx_1);
    *pvVar8 = dVar5;
  }
  for (local_98 = 0; uVar2 = local_98,
      sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40), uVar2 < sVar7;
      local_98 = local_98 + 1) {
    pvVar1 = *(value_type *)(pvStack_80 + local_98 * 2);
    ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,local_98);
    *ppvVar9 = pvVar1;
  }
  dpy = this->m_display;
  ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                      ((vector<void_*,_std::allocator<void_*>_> *)local_40,0);
  eglu::CallLogWrapper::eglGetConfigs
            (&this->super_CallLogWrapper,dpy,ppvVar9,numConfigRequested,(EGLint *)((long)&ndx + 4));
  dVar5 = eglu::CallLogWrapper::eglGetError(&this->super_CallLogWrapper);
  eglu::checkError(dVar5,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglQueryConfigTests.cpp"
                   ,0x76);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_218,
             (TestLog *)
             buffer.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_218,(int *)((long)&ndx + 4));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [18])0x2b576a0);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_218);
  ndx_2._4_4_ = 0;
  local_228 = 0;
  do {
    uVar2 = local_228;
    sVar7 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)local_40);
    if (sVar7 <= uVar2) {
LAB_017ea87a:
      tcu::TestLog::operator<<
                (&local_3a8,
                 (TestLog *)
                 buffer.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_3a8,(int *)((long)&ndx_2 + 4));
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [25])" values actually written");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a8);
      iVar3 = ndx._4_4_;
      iVar6 = ::deMax32(numConfigRequested,0);
      if (iVar6 < iVar3) {
        tcu::TestLog::operator<<
                  (&local_528,
                   (TestLog *)
                   buffer.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_528,(char (*) [44])"Fail, more configs returned than requested."
                            );
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_528);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Too many configs returned");
      }
      iVar3 = ndx_2._4_4_;
      iVar6 = ::deMax32(ndx._4_4_,0);
      if (iVar6 < iVar3) {
        tcu::TestLog::operator<<
                  (&local_6a8,
                   (TestLog *)
                   buffer.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_6a8,(char (*) [32])"Fail, buffer overflow detected.");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6a8);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Buffer overflow");
      }
      else if (ndx_2._4_4_ != ndx._4_4_) {
        tcu::TestLog::operator<<
                  (&local_828,
                   (TestLog *)
                   buffer.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_828,
                             (char (*) [81])
                             "Fail, reported number of returned configs differs from number of values written."
                            );
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_828);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Incorrect size");
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70);
      std::vector<void_*,_std::allocator<void_*>_>::~vector
                ((vector<void_*,_std::allocator<void_*>_> *)local_40);
      return;
    }
    ppvVar9 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,local_228);
    if (*ppvVar9 == *(value_type *)(pvStack_80 + local_228 * 2)) {
      ndx_2._4_4_ = (int)local_228;
      goto LAB_017ea87a;
    }
    local_228 = local_228 + 1;
  } while( true );
}

Assistant:

void checkGetConfigsBounds (de::Random& rnd, const int numConfigAll, const int numConfigRequested)
	{
		tcu::TestLog&			log				= m_testCtx.getLog();
		std::vector<EGLConfig>	buffer			(numConfigAll + 10);

		std::vector<deUint32>	magicBuffer		((buffer.size() * sizeof(EGLConfig)) / sizeof(deUint32) + 1);
		const EGLConfig*		magicConfigs	= reinterpret_cast<EGLConfig*>(&magicBuffer[0]);

		int						numConfigReturned;

		// Fill buffers with magic
		for (size_t ndx = 0; ndx < magicBuffer.size(); ndx++)	magicBuffer[ndx]	= rnd.getUint32();
		for (size_t ndx = 0; ndx < buffer.size(); ndx++)		buffer[ndx]			= magicConfigs[ndx];

		eglGetConfigs(m_display, &buffer[0], numConfigRequested, &numConfigReturned);
		eglu::checkError(eglGetError(), DE_NULL, __FILE__, __LINE__);

		log << TestLog::Message << numConfigReturned << " configs returned" << TestLog::EndMessage;

		// Compare results with stored magic
		{
			int	numOverwritten	= 0;

			for (size_t ndx = 0; ndx < buffer.size(); ndx++)
			{
				if (buffer[ndx] == magicConfigs[ndx])
				{
					numOverwritten = (int)ndx;
					break;
				}
			}

			log << TestLog::Message << numOverwritten << " values actually written" << TestLog::EndMessage;

			if (numConfigReturned > deMax32(numConfigRequested, 0))
			{
				log << TestLog::Message << "Fail, more configs returned than requested." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Too many configs returned");
			}

			if (numOverwritten > deMax32(numConfigReturned, 0))
			{
				log << TestLog::Message << "Fail, buffer overflow detected." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer overflow");
			}
			else if (numOverwritten != numConfigReturned)
			{
				log << TestLog::Message << "Fail, reported number of returned configs differs from number of values written." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Incorrect size");
			}
		}
	}